

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O2

void __thiscall Js::JavascriptArray::ValidateArrayCommon(JavascriptArray *this)

{
  SparseArraySegmentBase *pSVar1;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  undefined4 *puVar6;
  SegmentBTreeRoot *this_00;
  uint uVar7;
  char *message;
  char *error;
  uint lineNumber;
  SparseArraySegmentBase *seg;
  bool bVar8;
  ArraySegmentsVisitor local_48;
  ArraySegmentsVisitor visitor;
  
  visitor.seg = GetLastUsedSegment(this);
  seg = (this->head).ptr;
  if (visitor.seg == (SparseArraySegmentBase *)0x0 || seg == (SparseArraySegmentBase *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x2e4c,"(this != nullptr && head && lastUsedSegment)",
                                "Array should not be null");
    if (!bVar3) goto LAB_00a54044;
    *puVar6 = 0;
    seg = (this->head).ptr;
  }
  if (seg->left == 0) {
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x2e4d,"(head->left == 0)",
                                "Array always should have a segment starting at zero");
    if (!bVar3) goto LAB_00a54044;
    *puVar6 = 0;
    seg = (this->head).ptr;
  }
  bVar3 = false;
  while (seg != (SparseArraySegmentBase *)0x0) {
    bVar8 = seg == visitor.seg;
    if (seg->size < seg->length) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar6 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x2e59,"(seg->length <= seg->size)",
                                  "Length greater than size not possible");
      if (!bVar4) goto LAB_00a54044;
      *puVar6 = 0;
    }
    bVar3 = (bool)(bVar8 | bVar3);
    pSVar1 = (seg->next).ptr;
    if (pSVar1 == (SparseArraySegmentBase *)0x0) {
      uVar7 = seg->left;
      uVar5 = seg->length;
      if (CARRY4(uVar7,uVar5)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar6 = 1;
        bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                    ,0x2e64,"(seg->length <= MaxArrayLength - seg->left)",
                                    "Segment index range overflow");
        if (bVar8) {
          *puVar6 = 0;
          uVar7 = seg->left;
          uVar5 = seg->length;
          goto LAB_00a53f59;
        }
        goto LAB_00a54044;
      }
LAB_00a53f59:
      seg = pSVar1;
      if ((this->super_ArrayObject).length < uVar5 + uVar7) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar6 = 1;
        lineNumber = 0x2e65;
        error = "(seg->left + seg->length <= this->length)";
        message = "Segment index range exceeds array length";
LAB_00a53f9d:
        bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                    ,lineNumber,error,message);
        if (!bVar8) goto LAB_00a54044;
        *puVar6 = 0;
        seg = pSVar1;
      }
    }
    else {
      uVar7 = seg->left;
      uVar5 = pSVar1->left;
      if (uVar5 <= uVar7) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar6 = 1;
        bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                    ,0x2e5e,"(seg->left < next->left)",
                                    "Segment is adjacent to or overlaps with next segment");
        if (!bVar8) goto LAB_00a54044;
        *puVar6 = 0;
        uVar5 = pSVar1->left;
        uVar7 = seg->left;
      }
      if (uVar5 - uVar7 < seg->size) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar6 = 1;
        bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                    ,0x2e5f,"(seg->size <= (next->left - seg->left))",
                                    "Segment is adjacent to or overlaps with next segment");
        if (!bVar8) goto LAB_00a54044;
        *puVar6 = 0;
      }
      bVar8 = SparseArraySegmentBase::IsLeafSegment
                        (seg,((((((this->super_ArrayObject).super_DynamicObject.
                                  super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
                              super_JavascriptLibraryBase).scriptContext.ptr)->recycler);
      seg = pSVar1;
      if (bVar8) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar6 = 1;
        lineNumber = 0x2e60;
        error = 
        "(!SparseArraySegmentBase::IsLeafSegment(seg, this->GetScriptContext()->GetRecycler()))";
        message = "Leaf segment with a next pointer";
        goto LAB_00a53f9d;
      }
    }
  }
  if (!bVar3) {
    bVar3 = HasSegmentMap(this);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar6 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x2e6a,"(foundLastUsedSegment || HasSegmentMap())",
                                  "Corrupt lastUsedSegment in array header");
      if (!bVar3) {
LAB_00a54044:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar6 = 0;
    }
  }
  bVar3 = HasSegmentMap(this);
  if (bVar3) {
    local_48.seg = (this->head).ptr;
    this_00 = GetSegmentMap(this);
    SegmentBTree::Walk<ArraySegmentsVisitor>(&this_00->super_SegmentBTree,&local_48);
  }
  return;
}

Assistant:

void JavascriptArray::ValidateArrayCommon()
    {
        SparseArraySegmentBase * lastUsedSegment = this->GetLastUsedSegment();
        AssertMsg(this != nullptr && head && lastUsedSegment, "Array should not be null");
        AssertMsg(head->left == 0, "Array always should have a segment starting at zero");

        // Simple segments validation
        bool foundLastUsedSegment = false;
        SparseArraySegmentBase *seg = head;
        while(seg != nullptr)
        {
            if (seg == lastUsedSegment)
            {
                foundLastUsedSegment = true;
            }

            AssertMsg(seg->length <= seg->size , "Length greater than size not possible");

            SparseArraySegmentBase* next = seg->next;
            if (next != nullptr)
            {
                AssertMsg(seg->left < next->left, "Segment is adjacent to or overlaps with next segment");
                AssertMsg(seg->size <= (next->left - seg->left), "Segment is adjacent to or overlaps with next segment");
                AssertMsg(!SparseArraySegmentBase::IsLeafSegment(seg, this->GetScriptContext()->GetRecycler()), "Leaf segment with a next pointer");
            }
            else
            {
                AssertMsg(seg->length <= MaxArrayLength - seg->left, "Segment index range overflow");
                AssertMsg(seg->left + seg->length <= this->length, "Segment index range exceeds array length");
            }

            seg = next;
        }
        AssertMsg(foundLastUsedSegment || HasSegmentMap(), "Corrupt lastUsedSegment in array header");

        // Validate segmentMap if present
        if (HasSegmentMap())
        {
            ArraySegmentsVisitor visitor(head);
            GetSegmentMap()->Walk(visitor);
        }
    }